

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDarPhase(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint nFrames;
  uint uVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Cex_t *pAVar6;
  Aig_Man_t *p;
  Gia_Man_t *pAig;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  Abc_Cex_t *pCexNew;
  uint local_5c;
  uint local_58;
  uint local_54;
  Abc_Cex_t *local_38;
  
  pAVar5 = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  local_58 = 0;
  local_54 = 0;
  local_5c = 0;
  nFrames = 0;
LAB_0021a2a9:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"FPipcvh");
    iVar9 = globalUtilOptind;
    if (iVar3 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0021a3bd:
        Abc_Print(-1,pcVar7);
        goto LAB_0021a3c9;
      }
      nFrames = atoi(argv[globalUtilOptind]);
      uVar4 = nFrames;
    }
    else {
      if (0x68 < iVar3) {
        if (iVar3 == 0x69) {
          local_58 = local_58 ^ 1;
        }
        else if (iVar3 == 0x70) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          if (iVar3 != 0x76) goto LAB_0021a3c9;
          local_54 = local_54 ^ 1;
        }
        goto LAB_0021a2a9;
      }
      if (iVar3 == -1) {
        if (pAVar5 == (Abc_Ntk_t *)0x0) {
          pcVar7 = "Empty network.\n";
        }
        else if (pAVar5->ntkType == ABC_NTK_STRASH) {
          if (!bVar1) {
            if (pAVar5->nObjCounts[8] != 0) {
              if (bVar2) {
                Abc_NtkPhaseAbstract(pAVar5,0,local_5c,local_58,1,local_54);
                return 0;
              }
              pAVar5 = Abc_NtkPhaseAbstract(pAVar5,nFrames,local_5c,local_58,0,local_54);
              if (pAVar5 == (Abc_Ntk_t *)0x0) {
                return 0;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
              return 0;
            }
            pcVar7 = "The network is combinational.\n";
            iVar9 = 0;
LAB_0021a61a:
            Abc_Print(-1,pcVar7);
            return iVar9;
          }
          pAVar6 = pAbc->pCex;
          if (pAVar6 == (Abc_Cex_t *)0x0) {
            pcVar7 = "Counter-example is not available.\n";
          }
          else {
            iVar9 = pAVar5->vPis->nSize;
            if (pAVar6->nPis % iVar9 == 0) {
              pAVar6 = Abc_CexTransformPhase(pAVar6,iVar9,pAVar5->vPos->nSize,pAVar5->nObjCounts[8])
              ;
              iVar9 = 1;
              local_38 = pAVar6;
              p = Abc_NtkToDar(pAVar5,0,1);
              pAig = Gia_ManFromAig(p);
              iVar3 = Gia_ManSetFailedPoCex(pAig,pAVar6);
              Gia_ManStop(pAig);
              Aig_ManStop(p);
              if (iVar3 != -1) {
                Abc_FrameReplaceCex(pAbc,&local_38);
                return 0;
              }
              pcVar7 = "The counter-example does not fail any of the outputs of the original AIG.\n"
              ;
              goto LAB_0021a61a;
            }
            pcVar7 = "PI count of the CEX is not a multiple of PI count of the current AIG.\n";
          }
        }
        else {
          pcVar7 = "Only works for structrally hashed networks.\n";
        }
        iVar9 = -1;
        goto LAB_0021a4ef;
      }
      if (iVar3 != 0x50) {
        if (iVar3 != 99) goto LAB_0021a3c9;
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_0021a2a9;
      }
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_0021a3bd;
      }
      local_5c = atoi(argv[globalUtilOptind]);
      uVar4 = local_5c;
    }
    globalUtilOptind = iVar9 + 1;
    if ((int)uVar4 < 0) {
LAB_0021a3c9:
      Abc_Print(-2,"usage: phase [-FP <num>] [-ipcvh]\n");
      Abc_Print(-2,"\t         performs sequential cleanup of the current network\n");
      Abc_Print(-2,"\t         by removing nodes and latches that do not feed into POs\n");
      Abc_Print(-2,"\t-F num : the number of frames to abstract [default = %d]\n",(ulong)nFrames);
      Abc_Print(-2,"\t-P num : the number of prefix frames to skip [default = %d]\n",(ulong)local_5c
               );
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (local_58 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle ignoring the initial state [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle printing statistics about generators [default = %s]\n",pcVar7)
      ;
      Abc_Print(-2,"\t-c     : update the current CEX derived for a new AIG after \"phase\"\n");
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t         to match the current AIG (the one before \"phase\") [default = %s]\n"
                ,pcVar7);
      if (local_54 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
      pcVar7 = "\t-h     : print the command usage\n";
      iVar9 = -2;
LAB_0021a4ef:
      Abc_Print(iVar9,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDarPhase( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames, nPref;
    int fIgnore;
    int fPrint;
    int fUpdateCex;
    int c, fVerbose;
    extern Abc_Ntk_t * Abc_NtkPhaseAbstract( Abc_Ntk_t * pNtk, int nFrames, int nPref, int fIgnore, int fPrint, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames     = 0;
    nPref       = 0;
    fIgnore     = 0;
    fPrint      = 0;
    fUpdateCex  = 0;
    fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FPipcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPref = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPref < 0 )
                goto usage;
            break;
        case 'i':
            fIgnore ^= 1;
            break;
        case 'p':
            fPrint ^= 1;
            break;
        case 'c':
            fUpdateCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }
    if ( fUpdateCex )
    {
        Abc_Cex_t * pCexNew;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Counter-example is not available.\n" );
            return 1;
        }
        if ( pAbc->pCex->nPis % Abc_NtkPiNum(pNtk) != 0 )
        {
            Abc_Print( -1, "PI count of the CEX is not a multiple of PI count of the current AIG.\n" );
            return 1;
        }
        pCexNew = Abc_CexTransformPhase( pAbc->pCex, Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkLatchNum(pNtk) );
        {
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            Gia_Man_t * pGia = Gia_ManFromAig( pAig );
            int iPo = Gia_ManSetFailedPoCex( pGia, pCexNew );
            Gia_ManStop( pGia );
            Aig_ManStop( pAig );
            if ( iPo == -1 )
            {
                Abc_Print( -1, "The counter-example does not fail any of the outputs of the original AIG.\n" );
                return 1;
            }
        }
        Abc_FrameReplaceCex( pAbc, &pCexNew );
        return 0;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fPrint )
    {
        Abc_NtkPhaseAbstract( pNtk, 0, nPref, fIgnore, 1, fVerbose );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkPhaseAbstract( pNtk, nFrames, nPref, fIgnore, 0, fVerbose );
    if ( pNtkRes == NULL )
    {
//        Abc_Print( -1, "Phase abstraction has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: phase [-FP <num>] [-ipcvh]\n" );
    Abc_Print( -2, "\t         performs sequential cleanup of the current network\n" );
    Abc_Print( -2, "\t         by removing nodes and latches that do not feed into POs\n" );
    Abc_Print( -2, "\t-F num : the number of frames to abstract [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-P num : the number of prefix frames to skip [default = %d]\n", nPref );
    Abc_Print( -2, "\t-i     : toggle ignoring the initial state [default = %s]\n", fIgnore? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle printing statistics about generators [default = %s]\n", fPrint? "yes": "no" );
    Abc_Print( -2, "\t-c     : update the current CEX derived for a new AIG after \"phase\"\n" );
    Abc_Print( -2, "\t         to match the current AIG (the one before \"phase\") [default = %s]\n", fUpdateCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}